

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_be(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ushort *puVar1;
  undefined1 uVar2;
  ulong uVar3;
  uint uVar4;
  ma_uint64 mVar5;
  long lVar6;
  uint uVar7;
  undefined1 *puVar8;
  long lVar9;
  
  mVar5 = ma_dr_wav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (void *)0x0) {
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar7 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar7 = (uint)(pWav->fmt).blockAlign;
    }
    if (((pWav->translatedFormatTag & 0xfffe) != 6) || (uVar4 = 0, uVar7 == (pWav->fmt).channels)) {
      uVar4 = uVar7;
    }
    if (uVar4 == 0) {
      mVar5 = 0;
    }
    else {
      uVar4 = uVar4 / pWav->channels;
      if (uVar4 - 2 < 7) {
        lVar9 = mVar5 * pWav->channels;
        switch(uVar4) {
        case 2:
          if (lVar9 != 0) {
            lVar6 = 0;
            do {
              puVar1 = (ushort *)((long)pBufferOut + lVar6 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar6 = lVar6 + 1;
            } while (lVar9 - lVar6 != 0);
          }
          break;
        case 3:
          if (lVar9 != 0) {
            puVar8 = (undefined1 *)((long)pBufferOut + 2);
            do {
              uVar2 = puVar8[-2];
              puVar8[-2] = *puVar8;
              *puVar8 = uVar2;
              puVar8 = puVar8 + 3;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          break;
        case 4:
          if (lVar9 != 0) {
            lVar6 = 0;
            do {
              uVar7 = *(uint *)((long)pBufferOut + lVar6 * 4);
              *(uint *)((long)pBufferOut + lVar6 * 4) =
                   uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
              lVar6 = lVar6 + 1;
            } while (lVar9 - lVar6 != 0);
          }
          break;
        case 8:
          if (lVar9 != 0) {
            lVar6 = 0;
            do {
              uVar3 = *(ulong *)((long)pBufferOut + lVar6 * 8);
              *(ulong *)((long)pBufferOut + lVar6 * 8) =
                   uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                   (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                   | uVar3 << 0x38;
              lVar6 = lVar6 + 1;
            } while (lVar9 - lVar6 != 0);
          }
        }
      }
    }
  }
  return mVar5;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_be(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL) {
        ma_uint32 bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
        if (bytesPerFrame == 0) {
            return 0;
        }
        ma_dr_wav__bswap_samples(pBufferOut, framesRead*pWav->channels, bytesPerFrame/pWav->channels);
    }
    return framesRead;
}